

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoder.h
# Opt level: O2

void set_ref_ptrs(AV1_COMMON *cm,MACROBLOCKD *xd,MV_REFERENCE_FRAME ref0,MV_REFERENCE_FRAME ref1)

{
  scale_factors *psVar1;
  MV_REFERENCE_FRAME ref_frame;
  
  if (ref0 < '\x02') {
    ref0 = '\x01';
  }
  psVar1 = get_ref_scale_factors_const(cm,ref0);
  xd->block_ref_scale_factors[0] = psVar1;
  ref_frame = '\x01';
  if ('\x01' < ref1) {
    ref_frame = ref1;
  }
  psVar1 = get_ref_scale_factors_const(cm,ref_frame);
  xd->block_ref_scale_factors[1] = psVar1;
  return;
}

Assistant:

static inline void set_ref_ptrs(const AV1_COMMON *cm, MACROBLOCKD *xd,
                                MV_REFERENCE_FRAME ref0,
                                MV_REFERENCE_FRAME ref1) {
  xd->block_ref_scale_factors[0] =
      get_ref_scale_factors_const(cm, ref0 >= LAST_FRAME ? ref0 : 1);
  xd->block_ref_scale_factors[1] =
      get_ref_scale_factors_const(cm, ref1 >= LAST_FRAME ? ref1 : 1);
}